

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test::testBody
          (TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test *this)

{
  int *piVar1;
  MemoryLeakDetector *pMVar2;
  UtestShell *pUVar3;
  long lVar4;
  size_t sVar5;
  TestTerminator *pTVar6;
  char *pcVar7;
  char *pcVar8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58 [2];
  SimpleString local_38;
  void *local_28;
  char *str;
  int *n;
  size_t storedAmountOfLeaks;
  TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test *this_local;
  
  storedAmountOfLeaks = (size_t)this;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  n = (int *)MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();
  str = (char *)operator_new(4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                             ,0x1c9);
  local_28 = operator_new__(0x14,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                            ,0x1ca);
  pUVar3 = UtestShell::getCurrent();
  lVar4 = (long)n + 2;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,lVar4,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks + 2, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1cc,pTVar6);
  if (mutexLockCount == 2) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1cd,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_38);
    pcVar7 = SimpleString::asCharString(&local_38);
    StringFrom((int)local_58);
    pcVar8 = SimpleString::asCharString(local_58);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1cd,pTVar6);
    SimpleString::~SimpleString(local_58);
    SimpleString::~SimpleString(&local_38);
  }
  if (mutexUnlockCount == 2) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1ce,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_68);
    pcVar7 = SimpleString::asCharString(&local_68);
    StringFrom((int)&local_78);
    pcVar8 = SimpleString::asCharString(&local_78);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1ce,pTVar6);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&local_68);
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  if (str != (char *)0x0) {
    operator_delete(str,4);
  }
  pUVar3 = UtestShell::getCurrent();
  piVar1 = n;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,piVar1,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1d3,pTVar6);
  if (mutexLockCount == 4) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d4,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_88);
    pcVar7 = SimpleString::asCharString(&local_88);
    StringFrom((int)&local_98);
    pcVar8 = SimpleString::asCharString(&local_98);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d4,pTVar6);
    SimpleString::~SimpleString(&local_98);
    SimpleString::~SimpleString(&local_88);
  }
  if (mutexUnlockCount == 4) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d5,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_a8);
    pcVar7 = SimpleString::asCharString(&local_a8);
    StringFrom((int)&local_b8);
    pcVar8 = SimpleString::asCharString(&local_b8);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d5,pTVar6);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString(&local_a8);
  }
  MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningThreadSafe, turnOnThreadSafeNewDeleteOverloadsDebug)
{
    size_t storedAmountOfLeaks = MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all);

    MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();

    int *n = new int;
    char *str = new char[20];

    LONGS_EQUAL(storedAmountOfLeaks + 2, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(2, mutexLockCount);
    CHECK_EQUAL(2, mutexUnlockCount);

    delete [] str;
    delete n;

    LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(4, mutexLockCount);
    CHECK_EQUAL(4, mutexUnlockCount);

    MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
}